

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O1

word Gia_LutComputeTruth6(Gia_Man_t *p,int iObj,Vec_Wrd_t *vTruths)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  word wVar3;
  word *pwVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  if (-1 < iObj) {
    if (iObj < p->vMapping->nSize) {
      if (p->vMapping->pArray[(uint)iObj] == 0) {
        __assert_fail("Gia_ObjIsLut(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                      ,0x111,"word Gia_LutComputeTruth6(Gia_Man_t *, int, Vec_Wrd_t *)");
      }
      Gia_ManIncrementTravId(p);
      pVVar1 = p->vMapping;
      iVar6 = pVVar1->nSize;
      if (iObj < iVar6) {
        piVar2 = pVVar1->pArray;
        pwVar4 = s_Truths6;
        lVar5 = 0;
        do {
          lVar7 = (long)piVar2[(uint)iObj];
          if ((lVar7 < 0) || (iVar6 <= piVar2[(uint)iObj])) break;
          if (piVar2[lVar7] <= lVar5) {
            wVar3 = Gia_LutComputeTruth6_rec(p,iObj,vTruths);
            return wVar3;
          }
          iVar6 = piVar2[lVar7 + lVar5 + 1];
          lVar7 = (long)iVar6;
          if ((lVar7 < 0) || (vTruths->nSize <= iVar6)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
          }
          vTruths->pArray[lVar7] = *pwVar4;
          if (p->nTravIdsAlloc <= iVar6) {
            __assert_fail("Id < p->nTravIdsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x265,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
          }
          p->pTravIds[lVar7] = p->nTravIds;
          lVar5 = lVar5 + 1;
          iVar6 = pVVar1->nSize;
          pwVar4 = pwVar4 + 1;
        } while (iObj < iVar6);
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

word Gia_LutComputeTruth6( Gia_Man_t * p, int iObj, Vec_Wrd_t * vTruths )
{
    int k, iFan;
    assert( Gia_ObjIsLut(p, iObj) );
    Gia_ManIncrementTravId( p );
    Gia_LutForEachFanin( p, iObj, iFan, k )
    {
        Vec_WrdWriteEntry( vTruths, iFan, s_Truths6[k] );
        Gia_ObjSetTravIdCurrentId( p, iFan );
    }
    return Gia_LutComputeTruth6_rec( p, iObj, vTruths );
}